

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O3

void advance(ParserState *ps)

{
  size_t sVar1;
  void *pvVar2;
  Token TVar3;
  char *err;
  char *local_10;
  
  local_10 = (char *)0x0;
  sVar1 = (ps->toktext).len;
  (ps->lasttoktext).ptr = (ps->toktext).ptr;
  (ps->lasttoktext).len = sVar1;
  TVar3 = lex(&ps->currtext,&ps->toktext,&local_10);
  ps->tok = TVar3;
  if (TVar3 == TOK_ERROR) {
    if (ps->err != (char *)0x0) {
      safefree(local_10);
      return;
    }
    pvVar2 = (ps->toktext).ptr;
    sVar1 = (ps->toktext).len;
    ps->err = local_10;
    (ps->errloc).ptr = pvVar2;
    (ps->errloc).len = sVar1;
  }
  return;
}

Assistant:

static void advance(ParserState *ps)
{
    char *err = NULL;
    ps->lasttoktext = ps->toktext;
    ps->tok = lex(&ps->currtext, &ps->toktext, &err);
    if (ps->tok == TOK_ERROR)
        error(ps, err, ps->toktext);
}